

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O3

optional_ptr<duckdb::Binding,_true> __thiscall
duckdb::Binder::GetMatchingBinding
          (Binder *this,string *catalog_name,string *schema_name,string *table_name,
          string *column_name,ErrorData *error)

{
  optional_ptr<duckdb::DummyBinding,_true> *this_00;
  pointer pcVar1;
  size_t __n;
  _Alloc_hider _Var2;
  int iVar3;
  string *psVar4;
  optional_ptr<duckdb::Binding,_true> oVar5;
  bool bVar6;
  BindingAlias alias;
  string local_f0;
  string local_d0;
  string local_b0;
  BindingAlias local_90;
  
  if ((this->macro_binding).ptr != (DummyBinding *)0x0) {
    this_00 = &this->macro_binding;
    optional_ptr<duckdb::DummyBinding,_true>::CheckValid(this_00);
    psVar4 = BindingAlias::GetAlias_abi_cxx11_(&(this_00->ptr->super_Binding).alias);
    local_90.catalog._M_dataplus._M_p = (pointer)&local_90.catalog.field_2;
    pcVar1 = (psVar4->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar1,pcVar1 + psVar4->_M_string_length);
    _Var2._M_p = local_90.catalog._M_dataplus._M_p;
    __n = table_name->_M_string_length;
    if (__n == local_90.catalog._M_string_length) {
      if (__n == 0) {
        bVar6 = true;
      }
      else {
        iVar3 = bcmp((table_name->_M_dataplus)._M_p,local_90.catalog._M_dataplus._M_p,__n);
        bVar6 = iVar3 == 0;
      }
    }
    else {
      bVar6 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var2._M_p != &local_90.catalog.field_2) {
      operator_delete(_Var2._M_p);
    }
    if (bVar6) {
      return (optional_ptr<duckdb::Binding,_true>)&this_00->ptr->super_Binding;
    }
  }
  pcVar1 = (catalog_name->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + catalog_name->_M_string_length);
  pcVar1 = (schema_name->_M_dataplus)._M_p;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar1,pcVar1 + schema_name->_M_string_length);
  pcVar1 = (table_name->_M_dataplus)._M_p;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar1,pcVar1 + table_name->_M_string_length);
  BindingAlias::BindingAlias(&local_90,&local_b0,&local_d0,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  oVar5 = BindContext::GetBinding(&this->bind_context,&local_90,column_name,error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.alias._M_dataplus._M_p != &local_90.alias.field_2) {
    operator_delete(local_90.alias._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.schema._M_dataplus._M_p != &local_90.schema.field_2) {
    operator_delete(local_90.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.catalog._M_dataplus._M_p != &local_90.catalog.field_2) {
    operator_delete(local_90.catalog._M_dataplus._M_p);
  }
  return (optional_ptr<duckdb::Binding,_true>)oVar5.ptr;
}

Assistant:

optional_ptr<Binding> Binder::GetMatchingBinding(const string &catalog_name, const string &schema_name,
                                                 const string &table_name, const string &column_name,
                                                 ErrorData &error) {
	optional_ptr<Binding> binding;
	D_ASSERT(!lambda_bindings);
	if (macro_binding && table_name == macro_binding->GetAlias()) {
		binding = optional_ptr<Binding>(macro_binding.get());
	} else {
		BindingAlias alias(catalog_name, schema_name, table_name);
		binding = bind_context.GetBinding(alias, column_name, error);
	}
	return binding;
}